

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_bdd.c
# Opt level: O1

BDD sylvan_cube(BDDSET vars,uint8_t *cube)

{
  undefined8 uVar1;
  BDD BVar2;
  MTBDD MVar3;
  long lVar4;
  BDD low;
  
  lVar4 = (vars & 0xffffffffff) * 0x10;
  uVar1 = *(undefined8 *)(nodes->data + lVar4 + 8);
  BVar2 = sylvan_cube(vars & 0x8000000000000000 ^
                      *(ulong *)(nodes->data + lVar4) & 0x800000ffffffffff,cube + 1);
  if (*cube == '\x01') {
    if (BVar2 == 0) {
      return 0;
    }
    low = 0;
    MVar3 = BVar2;
  }
  else {
    if ((*cube != '\0') || (BVar2 == 0)) {
      return BVar2;
    }
    MVar3 = 0;
    low = BVar2;
  }
  MVar3 = _mtbdd_makenode((uint)((ulong)uVar1 >> 0x28),low,MVar3);
  return MVar3;
}

Assistant:

BDD
sylvan_cube(BDDSET vars, uint8_t *cube)
{
    if (sylvan_set_isempty(vars)) return sylvan_true;

    bddnode_t n = MTBDD_GETNODE(vars);
    BDDVAR v = bddnode_getvariable(n);
    vars = node_high(vars, n);

    BDD result = sylvan_cube(vars, cube+1);
    if (*cube == 0) {
        result = sylvan_makenode(v, result, sylvan_false);
    } else if (*cube == 1) {
        result = sylvan_makenode(v, sylvan_false, result);
    }

    return result;
}